

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationDataBuilder::getJamoCE32s
          (CollationDataBuilder *this,uint32_t *jamoCE32s,UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  byte bVar3;
  UChar32 UVar4;
  int32_t iVar5;
  uint32_t uVar6;
  bool fromBase_00;
  bool local_5d;
  int local_40;
  UChar32 jamo_1;
  int32_t j_1;
  uint32_t ce32;
  int iStack_30;
  UBool fromBase;
  UChar32 jamo;
  int32_t j;
  UBool needToCopyFromBase;
  UBool anyJamoAssigned;
  UErrorCode *errorCode_local;
  uint32_t *jamoCE32s_local;
  CollationDataBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    jamo._3_1_ = this->base == (CollationData *)0x0;
    bVar1 = false;
    for (iStack_30 = 0; iStack_30 < 0x43; iStack_30 = iStack_30 + 1) {
      UVar4 = jamoCpFromIndex(iStack_30);
      jamo_1 = utrie2_get32_63(this->trie,UVar4);
      bVar3 = Collation::isAssignedCE32(jamo_1);
      jamo._3_1_ = jamo._3_1_ | bVar3;
      fromBase_00 = jamo_1 == 0xc0;
      if (fromBase_00) {
        jamo_1 = CollationData::getCE32(this->base,UVar4);
      }
      UVar2 = Collation::isSpecialCE32(jamo_1);
      if (UVar2 != '\0') {
        iVar5 = Collation::tagFromCE32(jamo_1);
        switch(iVar5) {
        case 0:
        case 3:
        case 7:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
          *errorCode = U_INTERNAL_PROGRAM_ERROR;
          return '\0';
        case 1:
        case 2:
        case 4:
          break;
        case 5:
        case 6:
        case 8:
        case 9:
          if (fromBase_00) {
            jamo_1 = 0xc0;
            bVar1 = true;
          }
          break;
        case 0xe:
          jamo_1 = getCE32FromOffsetCE32(this,fromBase_00,UVar4,jamo_1);
          break;
        case 0xf:
          jamo_1 = 0xc0;
          bVar1 = true;
        }
      }
      jamoCE32s[iStack_30] = jamo_1;
    }
    if ((jamo._3_1_ != 0) && (bVar1)) {
      for (local_40 = 0; local_40 < 0x43; local_40 = local_40 + 1) {
        if (jamoCE32s[local_40] == 0xc0) {
          UVar4 = jamoCpFromIndex(local_40);
          uVar6 = CollationData::getCE32(this->base,UVar4);
          uVar6 = copyFromBaseCE32(this,UVar4,uVar6,'\x01',errorCode);
          jamoCE32s[local_40] = uVar6;
        }
      }
    }
    local_5d = false;
    if (jamo._3_1_ != 0) {
      UVar2 = ::U_SUCCESS(*errorCode);
      local_5d = UVar2 != '\0';
    }
    this_local._7_1_ = local_5d;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationDataBuilder::getJamoCE32s(uint32_t jamoCE32s[], UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    UBool anyJamoAssigned = base == NULL;  // always set jamoCE32s in the base data
    UBool needToCopyFromBase = FALSE;
    for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {  // Count across Jamo types.
        UChar32 jamo = jamoCpFromIndex(j);
        UBool fromBase = FALSE;
        uint32_t ce32 = utrie2_get32(trie, jamo);
        anyJamoAssigned |= Collation::isAssignedCE32(ce32);
        // TODO: Try to prevent [optimize [Jamo]] from counting as anyJamoAssigned.
        // (As of CLDR 24 [2013] the Korean tailoring does not optimize conjoining Jamo.)
        if(ce32 == Collation::FALLBACK_CE32) {
            fromBase = TRUE;
            ce32 = base->getCE32(jamo);
        }
        if(Collation::isSpecialCE32(ce32)) {
            switch(Collation::tagFromCE32(ce32)) {
            case Collation::LONG_PRIMARY_TAG:
            case Collation::LONG_SECONDARY_TAG:
            case Collation::LATIN_EXPANSION_TAG:
                // Copy the ce32 as-is.
                break;
            case Collation::EXPANSION32_TAG:
            case Collation::EXPANSION_TAG:
            case Collation::PREFIX_TAG:
            case Collation::CONTRACTION_TAG:
                if(fromBase) {
                    // Defer copying until we know if anyJamoAssigned.
                    ce32 = Collation::FALLBACK_CE32;
                    needToCopyFromBase = TRUE;
                }
                break;
            case Collation::IMPLICIT_TAG:
                // An unassigned Jamo should only occur in tests with incomplete bases.
                U_ASSERT(fromBase);
                ce32 = Collation::FALLBACK_CE32;
                needToCopyFromBase = TRUE;
                break;
            case Collation::OFFSET_TAG:
                ce32 = getCE32FromOffsetCE32(fromBase, jamo, ce32);
                break;
            case Collation::FALLBACK_TAG:
            case Collation::RESERVED_TAG_3:
            case Collation::BUILDER_DATA_TAG:
            case Collation::DIGIT_TAG:
            case Collation::U0000_TAG:
            case Collation::HANGUL_TAG:
            case Collation::LEAD_SURROGATE_TAG:
                errorCode = U_INTERNAL_PROGRAM_ERROR;
                return FALSE;
            }
        }
        jamoCE32s[j] = ce32;
    }
    if(anyJamoAssigned && needToCopyFromBase) {
        for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {
            if(jamoCE32s[j] == Collation::FALLBACK_CE32) {
                UChar32 jamo = jamoCpFromIndex(j);
                jamoCE32s[j] = copyFromBaseCE32(jamo, base->getCE32(jamo),
                                                /*withContext=*/ TRUE, errorCode);
            }
        }
    }
    return anyJamoAssigned && U_SUCCESS(errorCode);
}